

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i2d_pr.cc
# Opt level: O1

int i2d_PrivateKey(EVP_PKEY *a,uchar **pp)

{
  int iVar1;
  RSA *a_00;
  DSA *a_01;
  EC_KEY *key;
  
  iVar1 = EVP_PKEY_id(a);
  if (iVar1 == 0x198) {
    key = EVP_PKEY_get0_EC_KEY((EVP_PKEY *)a);
    iVar1 = i2d_ECPrivateKey((EC_KEY *)key,pp);
    return iVar1;
  }
  if (iVar1 != 0x74) {
    if (iVar1 == 6) {
      a_00 = EVP_PKEY_get0_RSA((EVP_PKEY *)a);
      iVar1 = i2d_RSAPrivateKey((RSA *)a_00,pp);
      return iVar1;
    }
    ERR_put_error(0xc,0,0xbb,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/i2d_pr.cc"
                  ,0x22);
    return -1;
  }
  a_01 = (DSA *)EVP_PKEY_get0_DSA((EVP_PKEY *)a);
  iVar1 = i2d_DSAPrivateKey(a_01,pp);
  return iVar1;
}

Assistant:

int i2d_PrivateKey(const EVP_PKEY *a, uint8_t **pp) {
  switch (EVP_PKEY_id(a)) {
    case EVP_PKEY_RSA:
      return i2d_RSAPrivateKey(EVP_PKEY_get0_RSA(a), pp);
    case EVP_PKEY_EC:
      return i2d_ECPrivateKey(EVP_PKEY_get0_EC_KEY(a), pp);
    case EVP_PKEY_DSA:
      return i2d_DSAPrivateKey(EVP_PKEY_get0_DSA(a), pp);
    default:
      // Although this file is in crypto/x509 for layering reasons, it emits
      // an error code from ASN1 for OpenSSL compatibility.
      OPENSSL_PUT_ERROR(ASN1, ASN1_R_UNSUPPORTED_PUBLIC_KEY_TYPE);
      return -1;
  }
}